

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O3

Vec_Bit_t * Acec_MultMarkPPs(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Vec_Bit_t *pVVar3;
  int *__s;
  Vec_Wrd_t *vTemp;
  word *pwVar4;
  Vec_Int_t *vSupp;
  int *piVar5;
  word wVar6;
  byte bVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  word wVar13;
  int iVar14;
  long lVar15;
  size_t __size;
  ulong local_60;
  
  uVar1 = p->nObjs;
  iVar10 = (((int)uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0);
  pVVar3 = (Vec_Bit_t *)malloc(0x10);
  iVar14 = iVar10 * 0x20;
  pVVar3->nCap = iVar14;
  if (iVar10 == 0) {
    __size = 0;
    __s = (int *)0x0;
  }
  else {
    __size = (long)iVar10 << 2;
    __s = (int *)malloc(__size);
  }
  pVVar3->pArray = __s;
  pVVar3->nSize = iVar14;
  local_60 = 0;
  memset(__s,0,__size);
  vTemp = (Vec_Wrd_t *)malloc(0x10);
  uVar2 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar2 = uVar1;
  }
  vTemp->nCap = uVar2;
  if (uVar2 == 0) {
    pwVar4 = (word *)0x0;
  }
  else {
    pwVar4 = (word *)malloc((long)(int)uVar2 << 3);
  }
  vTemp->pArray = pwVar4;
  vTemp->nSize = uVar1;
  memset(pwVar4,0,(long)(int)uVar1 << 3);
  vSupp = (Vec_Int_t *)malloc(0x10);
  vSupp->nCap = 100;
  vSupp->nSize = 0;
  piVar5 = (int *)malloc(400);
  vSupp->pArray = piVar5;
  Gia_ManCleanMark0(p);
  if (0 < p->nObjs) {
    uVar11 = 0;
    local_60 = 0;
    do {
      if ((~*(uint *)(p->pObjs + uVar11) & 0x1fffffff) != 0 &&
          -1 < (int)*(uint *)(p->pObjs + uVar11)) {
        wVar6 = Gia_ObjComputeTruth6Cis(p,(int)uVar11 * 2,vSupp,vTemp);
        iVar10 = vSupp->nSize;
        if ((long)iVar10 < 7) {
          wVar13 = wVar6;
          if (iVar10 < 1) {
            iVar12 = 0;
          }
          else {
            piVar5 = vSupp->pArray;
            lVar9 = 0;
            lVar15 = 0xa16518;
            pwVar4 = s_Truths6Neg;
            iVar12 = 0;
            do {
              bVar7 = (byte)(1 << ((byte)lVar9 & 0x1f));
              if ((*pwVar4 & (wVar13 >> (bVar7 & 0x3f) ^ wVar13)) != 0) {
                lVar8 = (long)iVar12;
                if (lVar8 < lVar9) {
                  if (piVar5 != (int *)0x0) {
                    piVar5[lVar8] = piVar5[lVar9];
                  }
                  bVar7 = (char)(-1 << ((byte)iVar12 & 0x1f)) + bVar7;
                  lVar8 = lVar8 * 0x90;
                  wVar13 = (wVar13 & *(ulong *)(lVar15 + 8 + lVar8)) >> (bVar7 & 0x3f) |
                           (*(ulong *)(lVar15 + lVar8) & wVar13) << (bVar7 & 0x3f) |
                           *(ulong *)(lVar15 + -8 + lVar8) & wVar13;
                }
                iVar12 = iVar12 + 1;
              }
              lVar9 = lVar9 + 1;
              pwVar4 = pwVar4 + 1;
              lVar15 = lVar15 + 0x18;
            } while (iVar10 != lVar9);
          }
          if ((iVar12 != iVar10) && (wVar6 = wVar13, iVar10 <= iVar12)) {
            __assert_fail("k < nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x754,"int Abc_Tt6MinBase(word *, int *, int)");
          }
          vSupp->nSize = iVar12;
          if (iVar12 < 6) {
            lVar9 = 0;
            do {
              if ((wVar6 == *(ulong *)((long)&DAT_00a16330 + lVar9)) ||
                 ((*(ulong *)((long)&DAT_00a16330 + lVar9) ^ wVar6) == 0xffffffffffffffff)) {
                if ((long)iVar14 <= (long)uVar11) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                                ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
                }
                __s[uVar11 >> 5 & 0x7ffffff] =
                     __s[uVar11 >> 5 & 0x7ffffff] | 1 << ((byte)uVar11 & 0x1f);
                local_60 = (ulong)((int)local_60 + 1);
                break;
              }
              lVar9 = lVar9 + 8;
            } while (lVar9 != 0x98);
          }
        }
      }
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)p->nObjs);
  }
  Gia_ManCleanMark0(p);
  printf("Collected %d pps.\n",local_60);
  if (vSupp->pArray != (int *)0x0) {
    free(vSupp->pArray);
  }
  free(vSupp);
  if (vTemp->pArray != (word *)0x0) {
    free(vTemp->pArray);
  }
  free(vTemp);
  return pVVar3;
}

Assistant:

Vec_Bit_t * Acec_MultMarkPPs( Gia_Man_t * p )
{
    word Saved[32] = {
        ABC_CONST(0xF335ACC0F335ACC0),
        ABC_CONST(0x35C035C035C035C0),
        ABC_CONST(0xD728D728D728D728),
        ABC_CONST(0xFD80FD80FD80FD80),
        ABC_CONST(0xACC0ACC0ACC0ACC0),
        ABC_CONST(0x7878787878787878),
        ABC_CONST(0x2828282828282828),
        ABC_CONST(0xD0D0D0D0D0D0D0D0),
        ABC_CONST(0x8080808080808080),
        ABC_CONST(0x8888888888888888),
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0x5555555555555555),

        ABC_CONST(0xD5A8D5A8D5A8D5A8),
        ABC_CONST(0x2A572A572A572A57),
        ABC_CONST(0xF3C0F3C0F3C0F3C0),
        ABC_CONST(0x5858585858585858),
        ABC_CONST(0xA7A7A7A7A7A7A7A7),
        ABC_CONST(0x2727272727272727),
        ABC_CONST(0xD8D8D8D8D8D8D8D8)
    };

    Vec_Bit_t * vRes = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    int i, iObj, nProds = 0;
    Gia_ManCleanMark0(p);
    Gia_ManForEachAndId( p, iObj )
    {
        word Truth = Gia_ObjComputeTruth6Cis( p, Abc_Var2Lit(iObj, 0), vSupp, vTemp );
        if ( Vec_IntSize(vSupp) > 6  )
            continue;
        vSupp->nSize = Abc_Tt6MinBase( &Truth, vSupp->pArray, vSupp->nSize );
        if ( Vec_IntSize(vSupp) > 5  )
            continue;
        for ( i = 0; i < 32 && Saved[i]; i++ )
        {
            if ( Truth == Saved[i] || Truth == ~Saved[i] )
            {
                Vec_BitWriteEntry( vRes, iObj, 1 );
                nProds++;
                break;
            }
        }
    }
    Gia_ManCleanMark0(p);
    printf( "Collected %d pps.\n", nProds );
    Vec_IntFree( vSupp );
    Vec_WrdFree( vTemp );
    return vRes;
}